

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btConvexHullInternal::Vertex_*>::resize
          (btAlignedObjectArray<btConvexHullInternal::Vertex_*> *this,int newsize,Vertex **fillData)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->m_size;
  lVar2 = (long)iVar1;
  if (iVar1 <= newsize) {
    if (iVar1 < newsize) {
      reserve(this,newsize);
    }
    for (; lVar2 < newsize; lVar2 = lVar2 + 1) {
      this->m_data[lVar2] = *fillData;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}